

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCoro.hpp
# Opt level: O0

Result SCoro::Impl::
       poll_fn<2ul,SCoro::SCoro<Initial,RecordTime,WaitForExpiry,PrintPollAttempts,RecordTime>>
                 (SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *self)

{
  Result RVar1;
  WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  *this;
  SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime> *self_local;
  
  this = &StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
          ::get_at((StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_WaitForExpiry,_RecordTime,_Initial>
                    *)self)->
          super_WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
  ;
  RVar1 = WaitForExpiry<SCoro::Impl::StagesImpl<SCoro::SCoro<Initial,_RecordTime,_WaitForExpiry,_PrintPollAttempts,_RecordTime>,_5UL,_RecordTime,_Initial>_>
          ::Poll(this);
  return (Result)RVar1.value;
}

Assistant:

constexpr static Result poll_fn(Stgs & self) noexcept
        {
            return self.get_at(Index<index>{}).Poll();
        }